

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

void __thiscall slang::ast::CoverageBinSymbol::resolve(CoverageBinSymbol *this)

{
  SyntaxKind SVar1;
  SyntaxNode *pSVar2;
  Compilation *this_00;
  BinsSelectExpressionSyntax *pBVar3;
  Type *pTVar4;
  OpenRangeListSyntax *pOVar5;
  WithClauseSyntax *pWVar6;
  Type *this_01;
  bool bVar7;
  int iVar8;
  BinsSelectionSyntax *pBVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type *this_02;
  CoverageBinsSyntax *pCVar10;
  undefined4 extraout_var_01;
  Expression *pEVar11;
  RangeCoverageBinInitializerSyntax *pRVar12;
  ExpressionSyntax *pEVar13;
  undefined4 extraout_var_02;
  ExpressionCoverageBinInitializerSyntax *pEVar14;
  Type *rhs;
  IdWithExprCoverageBinInitializerSyntax *pIVar15;
  size_t __n;
  Diagnostic *pDVar16;
  TransListCoverageBinInitializerSyntax *pTVar17;
  TransSetSyntax *pTVar18;
  TransRangeSyntax *args;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Scope *pSVar19;
  logic_error *this_03;
  long *plVar20;
  char *pcVar21;
  size_type *psVar22;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t __len;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  size_type extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *pEVar23;
  size_type extraout_RDX_07;
  ulong uVar24;
  size_t index;
  undefined1 __ptr [8];
  size_t index_00;
  ulong uVar25;
  size_t index_01;
  LookupLocation LVar26;
  string_view sVar27;
  SourceRange sourceRange;
  SmallVector<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_4UL>
  listBuffer;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  ASTContext local_200;
  undefined1 local_1c8 [8];
  char *pcStack_1c0;
  undefined1 local_1b8 [16];
  IteratorSymbol *local_1a8;
  Symbol *pSStack_1a0;
  AssertionInstanceDetails *local_198;
  SeparatedSyntaxList<slang::syntax::TransSetSyntax> *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 local_108 [24];
  Scope aSStack_f0 [3];
  string local_50;
  
  if (this->isResolved == true) {
    assert::assertFailed
              ("!isResolved",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
               ,0x1db,"void slang::ast::CoverageBinSymbol::resolve() const");
  }
  this->isResolved = true;
  pSVar2 = (this->super_Symbol).originatingSyntax;
  if ((pSVar2 == (SyntaxNode *)0x0) ||
     (pSVar19 = (this->super_Symbol).parentScope, pSVar19 == (Scope *)0x0)) {
    assert::assertFailed
              ("syntax && scope",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
               ,0x1e0,"void slang::ast::CoverageBinSymbol::resolve() const");
  }
  this_00 = pSVar19->compilation;
  LVar26 = LookupLocation::before(&this->super_Symbol);
  local_200.lookupIndex = LVar26.index;
  local_200.flags.m_bits = 0;
  local_200.instanceOrProc = (Symbol *)0x0;
  local_200.firstTempVar = (TempVarSymbol *)0x0;
  local_200.randomizeDetails = (RandomizeDetails *)0x0;
  local_200.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_200.scope.ptr = pSVar19;
  if (LVar26.scope != pSVar19 && LVar26.scope != (Scope *)0x0) {
    assert::assertFailed
              ("!lookupLocation.getScope() || lookupLocation.getScope() == &scope",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTContext.h"
               ,0x119,
               "slang::ast::ASTContext::ASTContext(const Scope &, LookupLocation, bitmask<ASTFlags>)"
              );
  }
  if (pSVar2->kind == BinsSelection) {
    pBVar9 = slang::syntax::SyntaxNode::as<slang::syntax::BinsSelectionSyntax>(pSVar2);
    __len = extraout_EDX;
    if (pBVar9->iff != (CoverageIffClauseSyntax *)0x0) {
      pEVar13 = (pBVar9->iff->expr).ptr;
      if (pEVar13 == (ExpressionSyntax *)0x0) goto LAB_003c1c9d;
      iVar8 = Expression::bind((int)pEVar13,(sockaddr *)&local_200,0x8000000);
      this->iffExpr = (Expression *)CONCAT44(extraout_var,iVar8);
      ASTContext::requireBooleanConvertible(&local_200,(Expression *)CONCAT44(extraout_var,iVar8));
      __len = extraout_EDX_00;
    }
    pBVar3 = (pBVar9->expr).ptr;
    if (pBVar3 != (BinsSelectExpressionSyntax *)0x0) {
      iVar8 = BinsSelectExpr::bind((int)pBVar3,(sockaddr *)&local_200,__len);
      this->selectExpr = (BinsSelectExpr *)CONCAT44(extraout_var_00,iVar8);
      return;
    }
    pcVar21 = 
    "T slang::not_null<slang::syntax::BinsSelectExpressionSyntax *>::get() const [T = slang::syntax::BinsSelectExpressionSyntax *]"
    ;
  }
  else {
    pTVar4 = ((not_null<const_slang::ast::Type_*> *)&pSVar19->thisSym)->ptr;
    if ((pTVar4->super_Symbol).kind != Coverpoint) {
      assert::assertFailed
                ("T::isKind(kind)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                 ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::CoverpointSymbol]")
      ;
    }
    this_02 = DeclaredType::getType((DeclaredType *)&pTVar4[1].super_Symbol.nextInScope);
    pCVar10 = slang::syntax::SyntaxNode::as<slang::syntax::CoverageBinsSyntax>(pSVar2);
    if (pCVar10->iff != (CoverageIffClauseSyntax *)0x0) {
      pEVar13 = (pCVar10->iff->expr).ptr;
      if (pEVar13 == (ExpressionSyntax *)0x0) goto LAB_003c1c9d;
      iVar8 = Expression::bind((int)pEVar13,(sockaddr *)&local_200,0x8000000);
      this->iffExpr = (Expression *)CONCAT44(extraout_var_01,iVar8);
      ASTContext::requireBooleanConvertible
                (&local_200,(Expression *)CONCAT44(extraout_var_01,iVar8));
    }
    if ((pCVar10->size != (CoverageBinsArraySizeSyntax *)0x0) &&
       (pEVar13 = pCVar10->size->expr, pEVar13 != (ExpressionSyntax *)0x0)) {
      pEVar11 = bindCovergroupExpr(pEVar13,&local_200,(Type *)0x0,(bitmask<slang::ast::ASTFlags>)0x0
                                  );
      this->numberOfBinsExpr = pEVar11;
      ASTContext::requireIntegral(&local_200,pEVar11);
    }
    pSVar2 = &((pCVar10->initializer).ptr)->super_SyntaxNode;
    if (pSVar2 == (SyntaxNode *)0x0) {
      pcVar21 = 
      "T slang::not_null<slang::syntax::CoverageBinInitializerSyntax *>::get() const [T = slang::syntax::CoverageBinInitializerSyntax *]"
      ;
      goto LAB_003c1cff;
    }
    SVar1 = pSVar2->kind;
    if ((int)SVar1 < 0xd6) {
      if (SVar1 == DefaultCoverageBinInitializer) {
        return;
      }
      if (SVar1 != ExpressionCoverageBinInitializer) {
LAB_003c1d09:
        this_03 = (logic_error *)__cxa_allocate_exception(0x10);
        local_128[0] = local_118;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_128,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
                   ,"");
        plVar20 = (long *)std::__cxx11::string::append((char *)local_128);
        local_168._M_dataplus._M_p = (pointer)*plVar20;
        psVar22 = (size_type *)(plVar20 + 2);
        if ((size_type *)local_168._M_dataplus._M_p == psVar22) {
          local_168.field_2._M_allocated_capacity = *psVar22;
          local_168.field_2._8_8_ = plVar20[3];
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar22;
        }
        local_168._M_string_length = plVar20[1];
        *plVar20 = (long)psVar22;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        std::__cxx11::to_string(&local_50,0x246);
        std::operator+(&local_148,&local_168,&local_50);
        plVar20 = (long *)std::__cxx11::string::append((char *)&local_148);
        local_1c8 = (undefined1  [8])*plVar20;
        pSVar19 = (Scope *)(plVar20 + 2);
        if (local_1c8 == (undefined1  [8])pSVar19) {
          local_1b8._0_8_ = pSVar19->compilation;
          local_1b8._8_8_ = *(char (*) [8])(plVar20 + 3);
          local_1c8 = (undefined1  [8])local_1b8;
        }
        else {
          local_1b8._0_8_ = pSVar19->compilation;
        }
        pcStack_1c0 = (char *)plVar20[1];
        *plVar20 = (long)pSVar19;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        plVar20 = (long *)std::__cxx11::string::append(local_1c8);
        local_108._0_8_ = *plVar20;
        pSVar19 = (Scope *)(plVar20 + 2);
        if ((Scope *)local_108._0_8_ == pSVar19) {
          local_108._16_8_ = pSVar19->compilation;
          aSStack_f0[0].compilation = *(Compilation **)(plVar20 + 3);
          local_108._0_8_ = (Scope *)(local_108 + 0x10);
        }
        else {
          local_108._16_8_ = pSVar19->compilation;
        }
        local_108._8_8_ = plVar20[1];
        *plVar20 = (long)pSVar19;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        std::logic_error::logic_error(this_03,(string *)local_108);
        __cxa_throw(this_03,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pEVar14 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionCoverageBinInitializerSyntax>
                          (pSVar2);
      pEVar13 = (pEVar14->expr).ptr;
      if (pEVar13 != (ExpressionSyntax *)0x0) {
        pEVar11 = bindCovergroupExpr(pEVar13,&local_200,(Type *)0x0,
                                     (bitmask<slang::ast::ASTFlags>)0x0);
        this->setCoverageExpr = pEVar11;
        bVar7 = Expression::bad(pEVar11);
        if (bVar7) {
          return;
        }
        this_01 = (this->setCoverageExpr->type).ptr;
        if (this_01 != (Type *)0x0) {
          bVar7 = Type::isArray(this_01);
          if (bVar7) {
            if (this_01->canonical == (Type *)0x0) {
              Type::resolveCanonical(this_01);
            }
            if ((this_01->canonical->super_Symbol).kind != AssociativeArrayType) {
              rhs = Type::getArrayElementType(this_01);
              bVar7 = Type::isAssignmentCompatible(this_02,rhs);
              if (bVar7) {
                return;
              }
            }
          }
          pDVar16 = ASTContext::addDiag(&local_200,(DiagCode)0x120006,
                                        this->setCoverageExpr->sourceRange);
          pDVar16 = ast::operator<<(pDVar16,this_01);
          pDVar16 = Diagnostic::operator<<(pDVar16,(pTVar4->super_Symbol).name);
          ast::operator<<(pDVar16,this_02);
          return;
        }
        pcVar21 = 
        "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
        goto LAB_003c1cff;
      }
    }
    else {
      if (SVar1 != IdWithExprCoverageBinInitializer) {
        if (SVar1 == TransListCoverageBinInitializer) {
          local_1c8 = (undefined1  [8])(local_1b8 + 8);
          pcStack_1c0 = (char *)0x0;
          local_1b8._0_8_ = 4;
          pTVar17 = slang::syntax::SyntaxNode::
                    as<slang::syntax::TransListCoverageBinInitializerSyntax>(pSVar2);
          uVar24 = (pTVar17->sets).elements.size_ + 1;
          pEVar23 = extraout_RDX_02;
          if (1 < uVar24) {
            local_170 = &pTVar17->sets;
            index_00 = 0;
            do {
              pTVar18 = slang::syntax::SeparatedSyntaxList<slang::syntax::TransSetSyntax>::
                        operator[](local_170,index_00);
              local_108._0_8_ = aSStack_f0;
              local_108._8_8_ = (char *)0x0;
              local_108._16_8_ = 4;
              uVar25 = (pTVar18->ranges).elements.size_ + 1;
              pEVar23 = extraout_RDX_03;
              if (1 < uVar25) {
                index_01 = 0;
                do {
                  args = slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>::
                         operator[](&pTVar18->ranges,index_01);
                  SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::
                  emplace_back<slang::syntax::TransRangeSyntax&,slang::ast::Type_const&,slang::ast::ASTContext&>
                            ((SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *)
                             local_108,args,this_02,&local_200);
                  index_01 = index_01 + 1;
                  pEVar23 = extraout_RDX_04;
                } while (uVar25 >> 1 != index_01);
              }
              iVar8 = SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::copy
                                ((SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *)
                                 local_108,(EVP_PKEY_CTX *)this_00,pEVar23);
              local_148._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_03,iVar8);
              SmallVectorBase<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
              ::
              emplace_back<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
                        ((SmallVectorBase<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
                          *)local_1c8,
                         (span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>
                          *)&local_148);
              pEVar23 = extraout_RDX_05;
              if ((Scope *)local_108._0_8_ != aSStack_f0) {
                free((void *)local_108._0_8_);
                pEVar23 = extraout_RDX_06;
              }
              index_00 = index_00 + 1;
            } while (index_00 != uVar24 >> 1);
          }
          iVar8 = SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                  ::copy((SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                          *)local_1c8,(EVP_PKEY_CTX *)this_00,pEVar23);
          (this->transList).data_ = (pointer)CONCAT44(extraout_var_04,iVar8);
          (this->transList).size_ = extraout_RDX_07;
          pSVar19 = (Scope *)(local_1b8 + 8);
          __ptr = local_1c8;
        }
        else {
          if (SVar1 != RangeCoverageBinInitializer) goto LAB_003c1d09;
          local_108._0_8_ = aSStack_f0;
          local_108._8_8_ = (char *)0x0;
          local_108._16_8_ = 5;
          pRVar12 = slang::syntax::SyntaxNode::as<slang::syntax::RangeCoverageBinInitializerSyntax>
                              (pSVar2);
          pOVar5 = (pRVar12->ranges).ptr;
          if (pOVar5 == (OpenRangeListSyntax *)0x0) {
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x26,
                       "T slang::not_null<slang::syntax::OpenRangeListSyntax *>::get() const [T = slang::syntax::OpenRangeListSyntax *]"
                      );
          }
          uVar24 = (pOVar5->valueRanges).elements.size_ + 1;
          pEVar23 = extraout_RDX;
          if (1 < uVar24) {
            index = 0;
            do {
              pEVar13 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                        operator[](&pOVar5->valueRanges,index);
              local_1c8 = (undefined1  [8])
                          bindCovergroupExpr(pEVar13,&local_200,this_02,
                                             (bitmask<slang::ast::ASTFlags>)
                                             ((ulong)((pEVar13->super_SyntaxNode).kind ==
                                                     OpenRangeExpression) << 0xb));
              SmallVectorBase<slang::ast::Expression_const*>::
              emplace_back<slang::ast::Expression_const*>
                        ((SmallVectorBase<slang::ast::Expression_const*> *)local_108,
                         (Expression **)local_1c8);
              index = index + 1;
              pEVar23 = extraout_RDX_00;
            } while (uVar24 >> 1 != index);
          }
          iVar8 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                            ((SmallVectorBase<const_slang::ast::Expression_*> *)local_108,
                             (EVP_PKEY_CTX *)this_00,pEVar23);
          (this->values).data_ = (pointer)CONCAT44(extraout_var_02,iVar8);
          (this->values).size_ = extraout_RDX_01;
          pWVar6 = pRVar12->withClause;
          if (pWVar6 != (WithClauseSyntax *)0x0) {
            if (local_200.scope.ptr == (Scope *)0x0) {
              pcVar21 = 
              "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
              ;
LAB_003c1de1:
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x26,pcVar21);
            }
            local_1c8 = (undefined1  [8])0x4;
            pcStack_1c0 = "item";
            local_1a8 = BumpAllocator::
                        emplace<slang::ast::IteratorSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation_const&,slang::ast::Type_const&>
                                  (&this_00->super_BumpAllocator,local_200.scope.ptr,
                                   (basic_string_view<char,_std::char_traits<char>_> *)local_1c8,
                                   &(pTVar4->super_Symbol).location,this_02);
            pcStack_1c0 = (char *)CONCAT44(local_200._12_4_,local_200.lookupIndex);
            pSStack_1a0 = (Symbol *)local_200.randomizeDetails;
            local_198 = local_200.assertionInstance;
            local_1b8._0_8_ = local_200.flags.m_bits;
            local_1b8._8_8_ = local_200.instanceOrProc;
            local_1c8 = (undefined1  [8])local_200.scope.ptr;
            (local_1a8->super_TempVarSymbol).nextTemp = local_200.firstTempVar;
            pEVar13 = (pWVar6->expr).ptr;
            if (pEVar13 == (ExpressionSyntax *)0x0) {
              pcVar21 = 
              "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
              ;
              goto LAB_003c1de1;
            }
            pEVar11 = bindCovergroupExpr(pEVar13,(ASTContext *)local_1c8,(Type *)0x0,
                                         (bitmask<slang::ast::ASTFlags>)0x0);
            this->withExpr = pEVar11;
            ASTContext::requireBooleanConvertible((ASTContext *)local_1c8,pEVar11);
          }
          pSVar19 = aSStack_f0;
          __ptr = (undefined1  [8])local_108._0_8_;
        }
        if (__ptr == (undefined1  [8])pSVar19) {
          return;
        }
        free((void *)__ptr);
        return;
      }
      pIVar15 = slang::syntax::SyntaxNode::as<slang::syntax::IdWithExprCoverageBinInitializerSyntax>
                          (pSVar2);
      pWVar6 = (pIVar15->withClause).ptr;
      if (pWVar6 == (WithClauseSyntax *)0x0) {
        pcVar21 = 
        "T slang::not_null<slang::syntax::WithClauseSyntax *>::get() const [T = slang::syntax::WithClauseSyntax *]"
        ;
        goto LAB_003c1cff;
      }
      if (local_200.scope.ptr == (Scope *)0x0) {
        pcVar21 = 
        "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
        goto LAB_003c1cff;
      }
      local_108._0_8_ = (Scope *)0x4;
      local_108._8_8_ = "item";
      aSStack_f0[0].thisSym =
           (Symbol *)
           BumpAllocator::
           emplace<slang::ast::IteratorSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation_const&,slang::ast::Type_const&>
                     (&this_00->super_BumpAllocator,local_200.scope.ptr,
                      (basic_string_view<char,_std::char_traits<char>_> *)local_108,
                      &(pTVar4->super_Symbol).location,this_02);
      local_108._8_8_ = CONCAT44(local_200._12_4_,local_200.lookupIndex);
      aSStack_f0[0].nameMap = (SymbolMap *)local_200.randomizeDetails;
      aSStack_f0[0].firstMember = (Symbol *)local_200.assertionInstance;
      local_108._16_8_ = local_200.flags.m_bits;
      aSStack_f0[0].compilation = (Compilation *)local_200.instanceOrProc;
      local_108._0_8_ = local_200.scope.ptr;
      (((IteratorSymbol *)aSStack_f0[0].thisSym)->super_TempVarSymbol).nextTemp =
           local_200.firstTempVar;
      pEVar13 = (pWVar6->expr).ptr;
      if (pEVar13 != (ExpressionSyntax *)0x0) {
        pEVar11 = bindCovergroupExpr(pEVar13,(ASTContext *)local_108,(Type *)0x0,
                                     (bitmask<slang::ast::ASTFlags>)0x0);
        this->withExpr = pEVar11;
        ASTContext::requireBooleanConvertible((ASTContext *)local_108,pEVar11);
        sVar27 = parsing::Token::valueText(&pIVar15->id);
        __n = sVar27._M_len;
        if (__n == 0) {
          return;
        }
        if ((__n == (pTVar4->super_Symbol).name._M_len) &&
           (iVar8 = bcmp(sVar27._M_str,(pTVar4->super_Symbol).name._M_str,__n), iVar8 == 0)) {
          return;
        }
        sourceRange = parsing::Token::range(&pIVar15->id);
        pDVar16 = ASTContext::addDiag(&local_200,(DiagCode)0x100006,sourceRange);
        Diagnostic::operator<<(pDVar16,(pTVar4->super_Symbol).name);
        return;
      }
    }
LAB_003c1c9d:
    pcVar21 = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
  }
LAB_003c1cff:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,pcVar21);
}

Assistant:

void CoverageBinSymbol::resolve() const {
    ASSERT(!isResolved);
    isResolved = true;

    auto syntax = getSyntax();
    auto scope = getParentScope();
    ASSERT(syntax && scope);

    auto& comp = scope->getCompilation();
    ASTContext context(*scope, LookupLocation::before(*this));

    if (syntax->kind == SyntaxKind::BinsSelection) {
        auto& binsSyntax = syntax->as<BinsSelectionSyntax>();
        if (binsSyntax.iff) {
            iffExpr = &Expression::bind(*binsSyntax.iff->expr, context,
                                        ASTFlags::AllowCoverageSampleFormal);
            context.requireBooleanConvertible(*iffExpr);
        }

        selectExpr = &BinsSelectExpr::bind(*binsSyntax.expr, context);
        return;
    }

    auto& coverpoint = scope->asSymbol().as<CoverpointSymbol>();
    auto& type = coverpoint.getType();

    auto& binsSyntax = syntax->as<CoverageBinsSyntax>();
    if (binsSyntax.iff) {
        iffExpr = &Expression::bind(*binsSyntax.iff->expr, context,
                                    ASTFlags::AllowCoverageSampleFormal);
        context.requireBooleanConvertible(*iffExpr);
    }

    if (binsSyntax.size && binsSyntax.size->expr) {
        numberOfBinsExpr = &bindCovergroupExpr(*binsSyntax.size->expr, context);
        context.requireIntegral(*numberOfBinsExpr);
    }

    auto bindWithExpr = [&](const WithClauseSyntax& withSyntax) {
        // Create the iterator variable and set it up with an AST context so that it
        // can be found by the iteration expression.
        auto it = comp.emplace<IteratorSymbol>(*context.scope, "item"sv, coverpoint.location, type);

        ASTContext iterCtx = context;
        it->nextTemp = std::exchange(iterCtx.firstTempVar, it);

        withExpr = &bindCovergroupExpr(*withSyntax.expr, iterCtx);
        iterCtx.requireBooleanConvertible(*withExpr);
    };

    auto init = binsSyntax.initializer;
    switch (init->kind) {
        case SyntaxKind::RangeCoverageBinInitializer: {
            SmallVector<const Expression*> buffer;
            auto& rcbis = init->as<RangeCoverageBinInitializerSyntax>();
            for (auto elem : rcbis.ranges->valueRanges) {
                bitmask<ASTFlags> flags;
                if (elem->kind == SyntaxKind::OpenRangeExpression)
                    flags = ASTFlags::AllowUnboundedLiteral;

                auto& expr = bindCovergroupExpr(*elem, context, &type, flags);
                buffer.push_back(&expr);
            }
            values = buffer.copy(comp);

            if (rcbis.withClause)
                bindWithExpr(*rcbis.withClause);
            break;
        }
        case SyntaxKind::IdWithExprCoverageBinInitializer: {
            auto& iwecbi = init->as<IdWithExprCoverageBinInitializerSyntax>();
            bindWithExpr(*iwecbi.withClause);

            auto targetName = iwecbi.id.valueText();
            if (!targetName.empty() && targetName != coverpoint.name)
                context.addDiag(diag::CoverageBinTargetName, iwecbi.id.range()) << coverpoint.name;
            break;
        }
        case SyntaxKind::TransListCoverageBinInitializer: {
            SmallVector<TransSet, 4> listBuffer;
            for (auto setElem : init->as<TransListCoverageBinInitializerSyntax>().sets) {
                SmallVector<TransRangeList, 4> setBuffer;
                for (auto rangeElem : setElem->ranges)
                    setBuffer.emplace_back(*rangeElem, type, context);
                listBuffer.push_back(setBuffer.copy(comp));
            }
            transList = listBuffer.copy(comp);
            break;
        }
        case SyntaxKind::ExpressionCoverageBinInitializer:
            setCoverageExpr = &bindCovergroupExpr(
                *init->as<ExpressionCoverageBinInitializerSyntax>().expr, context);

            if (!setCoverageExpr->bad()) {
                auto& t = *setCoverageExpr->type;
                if (!t.isArray() || t.isAssociativeArray() ||
                    !type.isAssignmentCompatible(*t.getArrayElementType())) {

                    auto& diag = context.addDiag(diag::CoverageSetType,
                                                 setCoverageExpr->sourceRange);
                    diag << t << coverpoint.name << type;
                }
            }
            break;
        case SyntaxKind::DefaultCoverageBinInitializer:
            // Already handled at construction time.
            break;
        default:
            ASSUME_UNREACHABLE;
    }
}